

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O0

value_type_conflict1
amrex::fudetail::
ReduceMin_host<amrex::FArrayBox,PeleLM::activeControl(int,int,double,double)::__1,void>
          (FabArray<amrex::FArrayBox> *fa,IntVect *nghost,anon_class_136_3_bb2610a9 *f)

{
  bool bVar1;
  double *pdVar2;
  Array4<const_double> *arr;
  Box *bx;
  MFIter mfi;
  value_type r;
  Real local_f8;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_ffffffffffffff10;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff37;
  FabArrayBase *in_stack_ffffffffffffff38;
  MFIter *in_stack_ffffffffffffff40;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  MFIter *in_stack_ffffffffffffff50;
  undefined1 local_a4 [28];
  undefined1 *local_88;
  Array4<const_double> *in_stack_ffffffffffffffc8;
  Box *in_stack_ffffffffffffffd0;
  anon_class_136_3_bb2610a9 *in_stack_ffffffffffffffd8;
  double local_20 [4];
  
  local_20[0] = std::numeric_limits<double>::max();
  MFIter::MFIter(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37
                );
  while( true ) {
    bVar1 = MFIter::isValid((MFIter *)&stack0xffffffffffffff80);
    if (!bVar1) break;
    MFIter::growntilebox(in_stack_ffffffffffffff50,(IntVect *)in_stack_ffffffffffffff48);
    local_88 = local_a4;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffff18,(MFIter *)in_stack_ffffffffffffff10._M_head_impl);
    in_stack_ffffffffffffff50 = (MFIter *)&stack0xffffffffffffff10;
    local_f8 = PeleLM::activeControl::anon_class_136_3_bb2610a9::operator()
                         (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                          in_stack_ffffffffffffffc8);
    pdVar2 = std::min<double>(local_20,&local_f8);
    local_20[0] = *pdVar2;
    MFIter::operator++((MFIter *)&stack0xffffffffffffff80);
  }
  MFIter::~MFIter((MFIter *)in_stack_ffffffffffffff10._M_head_impl);
  return local_20[0];
}

Assistant:

typename FAB::value_type
ReduceMin_host (FabArray<FAB> const& fa, IntVect const& nghost, F&& f)
{
    using value_type = typename FAB::value_type;
    value_type r = std::numeric_limits<value_type>::max();

#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(min:r)
#endif
    for (MFIter mfi(fa,true); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(nghost);
        const auto& arr = fa.const_array(mfi);
        r = std::min(r, f(bx, arr));
    }
    return r;
}